

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O0

void av1_initialize_enc(uint usage,aom_rc_mode end_usage)

{
  int in_ESI;
  int in_EDI;
  _Bool is_allintra;
  
  av1_rtcd();
  aom_dsp_rtcd();
  aom_scale_rtcd();
  av1_init_intra_predictors();
  av1_init_me_luts();
  if (in_EDI == 2) {
    if (in_ESI == 3) {
      return;
    }
  }
  else {
    av1_init_wedge_masks();
  }
  av1_rc_init_minq_luts();
  return;
}

Assistant:

void av1_initialize_enc(unsigned int usage, enum aom_rc_mode end_usage) {
  bool is_allintra = usage == ALLINTRA;

  av1_rtcd();
  aom_dsp_rtcd();
  aom_scale_rtcd();
  av1_init_intra_predictors();
  av1_init_me_luts();
  if (!is_allintra) av1_init_wedge_masks();
  if (!is_allintra || end_usage != AOM_Q) av1_rc_init_minq_luts();
}